

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

int av1_rc_pick_q_and_bounds
              (AV1_COMP *cpi,int width,int height,int gf_index,int *bottom_index,int *top_index)

{
  AV1_COMMON *cm;
  RATE_CONTROL *pRVar1;
  long lVar2;
  PRIMARY_RATE_CONTROL *p_rc;
  byte bVar3;
  byte bVar4;
  FRAME_UPDATE_TYPE FVar5;
  aom_rc_mode aVar6;
  aom_superres_mode superres_mode;
  aom_bit_depth_t aVar7;
  AV1_PRIMARY *pAVar8;
  YV12_BUFFER_CONFIG *pYVar9;
  SequenceHeader *pSVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  undefined *puVar18;
  long lVar19;
  YV12_BUFFER_CONFIG *pYVar20;
  uint *puVar21;
  RefCntBuffer *pRVar22;
  int j;
  ulong uVar23;
  uint8_t *puVar24;
  int i;
  ulong uVar25;
  FRAME_TYPE frame_type;
  long lVar26;
  AV1_PRIMARY *pAVar27;
  uint *puVar28;
  uint uVar29;
  uint *puVar30;
  double dVar31;
  double dVar32;
  uint8_t *local_10a0;
  uint sse;
  aom_rc_mode local_1088;
  int local_1084;
  uint *local_1080;
  int local_1078;
  int local_1074;
  uint *local_1070;
  PRIMARY_RATE_CONTROL *local_1068;
  RATE_CONTROL *local_1060;
  int local_1054;
  long local_1050;
  long local_1048;
  long local_1040;
  uint local_1038 [1026];
  
  pAVar8 = cpi->ppi;
  aVar6 = (cpi->oxcf).rc_cfg.mode;
  local_1050 = (long)gf_index;
  local_1080 = (uint *)bottom_index;
  local_1070 = (uint *)top_index;
  if ((((aVar6 == AOM_Q) && ((pAVar8->gf_group).update_type[local_1050] != '\x03')) ||
      ((cpi->oxcf).pass != AOM_RC_ONE_PASS)) || (pAVar8->lap_enabled != 0)) {
    local_1060 = &cpi->rc;
    local_1068 = &pAVar8->p_rc;
    bVar3 = (cpi->common).current_frame.frame_type;
    superres_mode = cpi->superres_mode;
    bVar4 = (cpi->common).superres_scale_denominator;
    uVar12 = (uint)((bVar3 & 0xfd) == 0);
    local_1084 = gf_index;
    iVar11 = get_active_cq_level(local_1060,local_1068,&cpi->oxcf,uVar12,superres_mode,(uint)bVar4);
    if (aVar6 == AOM_Q) {
      iVar11 = get_active_cq_level(local_1060,local_1068,&cpi->oxcf,uVar12,superres_mode,(uint)bVar4
                                  );
      local_1038[0] = 0;
      uVar12 = (cpi->rc).active_worst_quality;
      sse = uVar12;
      if ((bVar3 & 0xfd) == 0) {
        get_intra_q_and_bounds(cpi,width,height,(int *)local_1038,(int *)&sse,iVar11);
      }
      else {
        local_1038[0] = get_active_best_quality(cpi,uVar12,iVar11,local_1084);
        sse = uVar12;
      }
      uVar13 = 1;
      if (1 < (int)local_1038[0]) {
        uVar13 = local_1038[0];
      }
      if (iVar11 < 1) {
        uVar13 = local_1038[0];
      }
      *local_1070 = sse;
      *local_1080 = uVar13;
      uVar12 = (cpi->rc).best_quality;
      if ((int)uVar12 < (int)*local_1070) {
        uVar12 = *local_1070;
      }
      *local_1070 = uVar12;
      uVar16 = (cpi->rc).worst_quality;
      if ((int)uVar16 <= (int)uVar12) {
        uVar12 = uVar16;
      }
      *local_1070 = uVar12;
      uVar12 = (cpi->rc).best_quality;
      if ((int)uVar12 < (int)*local_1080) {
        uVar12 = *local_1080;
      }
      *local_1080 = uVar12;
      uVar16 = (cpi->rc).worst_quality;
      if ((int)uVar16 <= (int)uVar12) {
        uVar12 = uVar16;
      }
      *local_1080 = uVar12;
      uVar12 = (cpi->rc).best_quality;
      if ((int)uVar13 <= (int)uVar12) {
        uVar13 = uVar12;
      }
      uVar12 = (cpi->rc).worst_quality;
      if ((int)uVar12 <= (int)uVar13) {
        uVar13 = uVar12;
      }
      goto LAB_001e1c07;
    }
    cm = &cpi->common;
    local_1038[0] = 0;
    uVar12 = (cpi->rc).active_worst_quality;
    sse = uVar12;
    if ((bVar3 & 0xfd) == 0) {
      get_intra_q_and_bounds(cpi,width,height,(int *)local_1038,(int *)&sse,iVar11);
      pAVar27 = cpi->ppi;
      uVar12 = sse;
      uVar13 = local_1038[0];
      if ((cpi->oxcf).rc_cfg.mode != AOM_Q) goto LAB_001e1929;
    }
    else {
      FVar5 = (pAVar8->gf_group).update_type[local_1050];
      iVar15 = (pAVar8->gf_group).layer_depth[local_1050];
      if (iVar15 - 7U < 0xfffffffb) {
        local_1038[0] = get_active_best_quality(cpi,uVar12,iVar11,local_1084);
      }
      else {
        local_1038[0] = (pAVar8->p_rc).active_best_quality[iVar15 - 1] + 1;
        if ((int)uVar12 <= (int)local_1038[0]) {
          local_1038[0] = uVar12;
        }
        local_1038[0] = (int)(uVar12 - local_1038[0]) / 2 + local_1038[0];
      }
      pAVar27 = pAVar8;
      if (((cpi->rc).is_src_frame_alt_ref == 0) &&
         ((((cpi->refresh_frame).golden_frame != false ||
           ((cpi->refresh_frame).alt_ref_frame != false)) || (FVar5 == '\x06')))) {
        sse = (int)(uVar12 * 3 + local_1038[0] + 2) / 4;
        uVar12 = sse;
      }
LAB_001e1929:
      uVar12 = (pAVar27->twopass).extend_maxq / 4 + uVar12;
      uVar13 = (pAVar27->twopass).extend_minq / -8 + local_1038[0];
    }
    if (((((cm->current_frame).frame_type & 0xfd) != 0) ||
        ((pAVar27->p_rc).this_key_frame_forced == 0)) ||
       ((pAVar27->twopass).last_kfgroup_zeromotion_pct < 0x5f)) {
      bVar3 = cpi->gf_frame_index;
      if ((0x32UL >> ((ulong)(pAVar27->gf_group).update_type[bVar3] & 0x3f) & 1) == 0) {
        iVar11 = (pAVar27->gf_group).layer_depth[bVar3];
        iVar15 = 6;
        if (iVar11 < 6) {
          iVar15 = iVar11;
        }
        dVar31 = arf_layer_deltas[iVar15];
      }
      else {
        dVar31 = 1.0;
      }
      iVar11 = av1_compute_qdelta_by_rate(cpi,(pAVar27->gf_group).frame_type[bVar3],uVar12,dVar31);
      uVar12 = iVar11 + uVar12;
      if ((int)uVar12 <= (int)uVar13) {
        uVar12 = uVar13;
      }
    }
    iVar11 = av1_frame_scaled(cm);
    uVar16 = uVar13;
    if ((iVar11 != 0) && (iVar11 = frame_is_kf_gf_arf(cpi), iVar11 == 0)) {
      iVar11 = av1_compute_qdelta_by_rate(cpi,(cpi->common).current_frame.frame_type,uVar13,2.0);
      uVar14 = (cpi->rc).best_quality;
      uVar16 = iVar11 + uVar13;
      if ((int)(iVar11 + uVar13) <= (int)uVar14) {
        uVar16 = uVar14;
      }
    }
    uVar14 = (cpi->rc).worst_quality;
    uVar29 = uVar14;
    if ((int)uVar16 < (int)uVar14) {
      uVar29 = uVar16;
    }
    uVar13 = (cpi->rc).best_quality;
    if ((int)uVar16 < (int)uVar13) {
      uVar29 = uVar13;
    }
    if ((int)uVar12 < (int)uVar14) {
      uVar14 = uVar12;
    }
    if ((int)uVar12 < (int)uVar29) {
      uVar14 = uVar29;
    }
    uVar13 = uVar29;
    if ((cpi->oxcf).rc_cfg.mode != AOM_Q) {
      if (((cm->current_frame).frame_type & 0xfd) == 0) {
        pAVar27 = cpi->ppi;
        if ((pAVar27->p_rc).this_key_frame_forced == 0) {
          if (((pAVar27->twopass).kf_zeromotion_pct < 99) || ((cpi->rc).frames_to_key < 2))
          goto LAB_001e1a50;
        }
        else {
          uVar12 = (pAVar27->p_rc).last_boosted_qindex;
          if ((pAVar27->twopass).last_kfgroup_zeromotion_pct < 0x5f) {
            uVar13 = (int)(uVar14 + uVar29) / 2;
            if ((int)uVar13 <= (int)uVar12) {
              uVar12 = uVar13;
            }
          }
          else {
            uVar13 = (pAVar27->p_rc).last_kf_qindex;
            if ((int)uVar13 < (int)uVar12) {
              uVar12 = uVar13;
            }
          }
          uVar13 = uVar14;
          if ((int)uVar12 < (int)uVar14) {
            uVar13 = uVar12;
          }
          if ((int)uVar12 < (int)uVar29) {
            uVar13 = uVar29;
          }
        }
      }
      else {
LAB_001e1a50:
        uVar13 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,uVar29,uVar14,width,height);
        if (((int)uVar14 < (int)uVar13) &&
           ((cpi->rc).this_frame_target < (cpi->rc).max_frame_bandwidth)) {
          uVar13 = uVar14;
        }
        if ((int)uVar13 <= (int)uVar29) {
          uVar13 = uVar29;
        }
      }
    }
    uVar12 = uVar14;
    if ((int)uVar14 < (int)uVar13) {
      uVar12 = uVar13;
    }
    if ((cpi->rc).this_frame_target < (cpi->rc).max_frame_bandwidth) {
      uVar12 = uVar14;
    }
    *local_1070 = uVar12;
    *local_1080 = uVar29;
    goto LAB_001e1c07;
  }
  if (aVar6 == AOM_CBR) {
    cpi->rec_sse = 0xffffffffffffffff;
    if ((((cpi->sf).hl_sf.accurate_bit_estimate != 0) &&
        ((cpi->common).current_frame.frame_type != '\0')) &&
       (pYVar9 = cpi->unscaled_source, pYVar9 != (YV12_BUFFER_CONFIG *)0x0)) {
      lVar19 = (long)(cpi->common).remapped_ref_idx[0];
      if (lVar19 == -1) {
        pRVar22 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar22 = (cpi->common).ref_frame_map[lVar19];
      }
      pYVar20 = &pRVar22->buf;
      if (pRVar22 == (RefCntBuffer *)0x0) {
        pYVar20 = (YV12_BUFFER_CONFIG *)0x0;
      }
      if (cpi->scaled_ref_buf[0] == (RefCntBuffer *)0x0) {
        local_10a0 = (pYVar9->field_5).buffers[0];
        iVar11 = (pYVar9->field_4).field_0.y_stride;
        puVar24 = (pYVar20->field_5).buffers[0];
        local_1074 = (pYVar20->field_4).field_0.y_stride;
        lVar19 = -2;
LAB_001e1fc7:
        if (lVar19 != 0) goto code_r0x001e1fd0;
        pSVar10 = (cpi->common).seq_params;
        local_1078 = pSVar10->mib_size >> (pSVar10->sb_size == BLOCK_128X128);
        local_1088 = ((cpi->common).mi_params.mi_cols + local_1078 + -1) / local_1078;
        local_1078 = (local_1078 + -1 + (cpi->common).mi_params.mi_rows) / local_1078;
        cpi->rec_sse = 0;
        local_1040 = (long)(int)((iVar11 - local_1088) * 0x40);
        local_1048 = (long)(int)((local_1074 - local_1088) * 0x40);
        lVar19 = 0;
        if ((int)local_1088 < 1) {
          local_1088 = 0;
        }
        if (local_1078 < 1) {
          local_1078 = 0;
        }
        iVar15 = 0;
        while (iVar15 != local_1078) {
          iVar17 = 0;
          local_1054 = iVar15;
          while (puVar30 = local_1038, iVar17 != local_1088) {
            local_1084 = iVar17;
            local_1068 = (PRIMARY_RATE_CONTROL *)lVar19;
            local_1060 = (RATE_CONTROL *)puVar24;
            memset(puVar30,0,0x1000);
            for (uVar25 = 0; pRVar1 = local_1060, uVar25 < 0x40; uVar25 = uVar25 + 4) {
              puVar28 = puVar30;
              for (uVar23 = 0; uVar23 < 0x40; uVar23 = uVar23 + 4) {
                uVar12 = aom_avg_4x4_sse2(local_10a0 + uVar23 + uVar25 * (long)iVar11,iVar11);
                puVar21 = puVar28;
                for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
                  for (lVar26 = 0; lVar26 != 4; lVar26 = lVar26 + 1) {
                    *(char *)((long)puVar21 + lVar26) = (char)uVar12;
                  }
                  puVar21 = puVar21 + 0x10;
                }
                puVar28 = puVar28 + 1;
              }
              puVar30 = puVar30 + 0x40;
            }
            (*cpi->ppi->fn_ptr[0xc].vf)
                      ((uint8_t *)local_1038,0x40,(uint8_t *)local_1060,local_1074,&sse);
            lVar19 = (long)local_1068 + (ulong)sse;
            local_10a0 = local_10a0 + 0x40;
            puVar24 = (uint8_t *)((long)pRVar1 + 0x40);
            iVar17 = local_1084 + 1;
          }
          local_10a0 = local_10a0 + local_1040;
          puVar24 = puVar24 + local_1048;
          iVar15 = local_1054 + 1;
        }
        if (0 < (int)(local_1078 * local_1088)) {
          cpi->rec_sse = lVar19 + (ulong)(lVar19 == 0);
        }
      }
    }
LAB_001e1e40:
    pAVar27 = cpi->ppi;
    uVar12 = calc_active_worst_quality_no_stats_cbr(cpi);
    aVar7 = ((cpi->common).seq_params)->bit_depth;
    if (aVar7 - AOM_BITS_8 < 5) {
      puVar18 = (&PTR_rtc_minq_8_00549910)[aVar7 - AOM_BITS_8];
    }
    else {
      puVar18 = (undefined *)0x0;
    }
    uVar13 = (cpi->rc).best_quality;
    if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
      if ((pAVar27->p_rc).this_key_frame_forced == 0) {
        uVar16 = uVar13;
        if ((cpi->common).current_frame.frame_number != 0) {
          iVar11 = get_kf_active_quality(&pAVar27->p_rc,(pAVar27->p_rc).avg_frame_qindex[0],aVar7);
          dVar31 = av1_convert_qindex_to_q(iVar11,aVar7);
          iVar15 = av1_compute_qdelta(&cpi->rc,dVar31,
                                      *(double *)
                                       (&DAT_004584a0 + (ulong)(height * width < 0x18c01) * 8) *
                                      dVar31,aVar7);
          uVar13 = (cpi->rc).best_quality;
          uVar16 = iVar15 + iVar11;
        }
      }
      else {
        iVar11 = (pAVar27->p_rc).last_boosted_qindex;
        dVar31 = av1_convert_qindex_to_q(iVar11,aVar7);
        iVar15 = av1_compute_qdelta(&cpi->rc,dVar31,dVar31 * 0.75,aVar7);
        uVar16 = iVar15 + iVar11;
        uVar13 = (cpi->rc).best_quality;
        if ((int)uVar16 <= (int)uVar13) {
          uVar16 = uVar13;
        }
      }
    }
    else if (((((cpi->rc).is_src_frame_alt_ref == 0) && (pAVar27->use_svc == 0)) &&
             ((cpi->oxcf).rc_cfg.gf_cbr_boost_pct != 0)) &&
            (((cpi->refresh_frame).golden_frame != false ||
             ((cpi->refresh_frame).alt_ref_frame == true)))) {
      uVar16 = uVar12;
      if ((1 < (cpi->rc).frames_since_key) &&
         (uVar16 = (pAVar27->p_rc).avg_frame_qindex[1], (int)uVar12 <= (int)uVar16)) {
        uVar16 = uVar12;
      }
      uVar16 = get_gf_active_quality(&pAVar27->p_rc,uVar16,aVar7);
    }
    else {
      uVar16 = (pAVar27->p_rc).avg_frame_qindex[1 < (cpi->common).current_frame.frame_number];
      if ((int)uVar12 <= (int)uVar16) {
        uVar16 = uVar12;
      }
      uVar16 = *(uint *)(puVar18 + (long)(int)uVar16 * 4);
    }
    puVar30 = local_1070;
    uVar14 = (cpi->rc).worst_quality;
    uVar29 = uVar14;
    if ((int)uVar16 < (int)uVar14) {
      uVar29 = uVar16;
    }
    if ((int)uVar16 < (int)uVar13) {
      uVar29 = uVar13;
    }
    if ((int)uVar12 < (int)uVar14) {
      uVar14 = uVar12;
    }
    if ((int)uVar12 < (int)uVar29) {
      uVar14 = uVar29;
    }
    *local_1070 = uVar14;
    *local_1080 = uVar29;
    if ((((cpi->common).current_frame.frame_type == '\0') &&
        ((pAVar27->p_rc).this_key_frame_forced == 0)) &&
       ((cpi->common).current_frame.frame_number != 0)) {
      iVar11 = av1_compute_qdelta_by_rate(cpi,'\0',uVar14,2.0);
      uVar12 = iVar11 + uVar14;
      *puVar30 = uVar12;
      if ((int)uVar12 <= (int)*local_1080) {
        uVar12 = *local_1080;
      }
      *puVar30 = uVar12;
    }
    uVar16 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,uVar29,uVar14,width,height);
    uVar12 = *puVar30;
    uVar13 = uVar16;
    if (((int)uVar12 < (int)uVar16) &&
       (uVar13 = uVar12, (cpi->rc).max_frame_bandwidth <= (cpi->rc).this_frame_target)) {
      *puVar30 = uVar16;
      uVar12 = uVar16;
      uVar13 = uVar16;
    }
    (cpi->rc).active_worst_quality = uVar12;
    goto LAB_001e1c07;
  }
  pRVar1 = &cpi->rc;
  p_rc = &pAVar8->p_rc;
  bVar3 = (cpi->common).current_frame.frame_type;
  uVar16 = get_active_cq_level(pRVar1,p_rc,&cpi->oxcf,(uint)((bVar3 & 0xfd) == 0),cpi->superres_mode
                               ,(uint)(cpi->common).superres_scale_denominator);
  aVar7 = ((cpi->common).seq_params)->bit_depth;
  uVar12 = (cpi->common).current_frame.frame_number;
  uVar13 = (pAVar8->p_rc).last_q[0];
  if (bVar3 == 0) {
    if (uVar12 == 0) {
      uVar14 = (cpi->rc).worst_quality;
    }
    else {
      uVar14 = uVar13 * 2;
    }
  }
  else {
    uVar14 = (pAVar8->p_rc).last_q[1];
    if (((cpi->rc).is_src_frame_alt_ref == 0) &&
       ((((cpi->refresh_frame).golden_frame != false ||
         ((cpi->refresh_frame).bwd_ref_frame != false)) ||
        ((cpi->refresh_frame).alt_ref_frame == true)))) {
      if (uVar12 == 1) {
        uVar14 = (int)(uVar13 * 5) / 4;
      }
    }
    else {
      if (uVar12 == 1) {
        uVar14 = uVar13;
      }
      uVar14 = uVar14 * 2;
    }
  }
  uVar29 = (cpi->rc).worst_quality;
  if ((int)uVar14 < (int)uVar29) {
    uVar29 = uVar14;
  }
  if (aVar7 - AOM_BITS_8 < 5) {
    puVar18 = (&PTR_inter_minq_8_005499d8)[aVar7 - AOM_BITS_8];
  }
  else {
    puVar18 = (undefined *)0x0;
  }
  local_1088 = aVar6;
  if ((bVar3 & 0xfd) == 0) {
    if (aVar6 == AOM_Q) {
      dVar31 = av1_convert_qindex_to_q(uVar16,aVar7);
      dVar32 = dVar31 * 0.25;
LAB_001e2354:
      iVar11 = av1_compute_qdelta(pRVar1,dVar31,dVar32,aVar7);
      uVar13 = (cpi->rc).best_quality;
LAB_001e2369:
      uVar12 = iVar11 + uVar16;
      if ((int)(iVar11 + uVar16) <= (int)uVar13) {
        uVar12 = uVar13;
      }
    }
    else if ((pAVar8->p_rc).this_key_frame_forced == 0) {
      iVar11 = get_kf_active_quality(p_rc,(pAVar8->p_rc).avg_frame_qindex[0],aVar7);
      dVar31 = av1_convert_qindex_to_q(iVar11,aVar7);
      iVar15 = av1_compute_qdelta(pRVar1,dVar31,
                                  *(double *)(&DAT_004584a0 + (ulong)(height * width < 0x18c01) * 8)
                                  * dVar31,aVar7);
      uVar12 = iVar15 + iVar11;
    }
    else {
      iVar11 = (pAVar8->p_rc).last_boosted_qindex;
      dVar31 = av1_convert_qindex_to_q(iVar11,aVar7);
      iVar15 = av1_compute_qdelta(pRVar1,dVar31,dVar31 * 0.75,aVar7);
      uVar12 = iVar15 + iVar11;
      uVar13 = (cpi->rc).best_quality;
      if ((int)uVar12 <= (int)uVar13) {
        uVar12 = uVar13;
      }
    }
  }
  else if (((cpi->rc).is_src_frame_alt_ref == 0) &&
          (((cpi->refresh_frame).golden_frame != false ||
           ((cpi->refresh_frame).alt_ref_frame == true)))) {
    if (((cpi->rc).frames_since_key < 2) ||
       (uVar12 = (pAVar8->p_rc).avg_frame_qindex[1], (int)uVar29 <= (int)uVar12)) {
      uVar12 = (pAVar8->p_rc).avg_frame_qindex[0];
    }
    if (aVar6 == AOM_Q) {
      dVar31 = av1_convert_qindex_to_q(uVar16,aVar7);
      if ((cpi->refresh_frame).alt_ref_frame == false) {
        dVar32 = 0.5;
      }
      else {
        dVar32 = 0.4;
      }
      dVar32 = dVar32 * dVar31;
      goto LAB_001e2354;
    }
    if (aVar6 == AOM_CQ) {
      if ((int)uVar16 < (int)uVar12) {
        uVar16 = uVar12;
      }
      iVar11 = get_gf_active_quality(p_rc,uVar16,aVar7);
      uVar12 = (iVar11 * 0xf) / 0x10;
    }
    else {
      uVar12 = get_gf_active_quality(p_rc,uVar12,aVar7);
    }
  }
  else {
    if (aVar6 == AOM_Q) {
      dVar31 = av1_convert_qindex_to_q(uVar16,aVar7);
      iVar11 = av1_compute_qdelta(pRVar1,dVar31,
                                  *(double *)
                                   (&DAT_00458540 +
                                   (ulong)((cpi->common).current_frame.frame_number & 0xf) * 8) *
                                  dVar31,aVar7);
      uVar13 = (cpi->rc).best_quality;
      goto LAB_001e2369;
    }
    uVar13 = *(uint *)(puVar18 + (long)(pAVar8->p_rc).avg_frame_qindex[1 < uVar12] * 4);
    if ((int)uVar16 < (int)uVar13) {
      uVar16 = uVar13;
    }
    uVar12 = uVar16;
    if (aVar6 != AOM_CQ) {
      uVar12 = uVar13;
    }
  }
  puVar30 = local_1070;
  uVar16 = (cpi->rc).worst_quality;
  uVar13 = uVar16;
  if ((int)uVar12 < (int)uVar16) {
    uVar13 = uVar12;
  }
  uVar14 = (cpi->rc).best_quality;
  if ((int)uVar12 < (int)uVar14) {
    uVar13 = uVar14;
  }
  if ((int)uVar29 < (int)uVar16) {
    uVar16 = uVar29;
  }
  if ((int)uVar29 < (int)uVar13) {
    uVar16 = uVar13;
  }
  *local_1070 = uVar16;
  *local_1080 = uVar13;
  frame_type = (cpi->common).current_frame.frame_type;
  if (((frame_type == '\0') && ((pAVar8->p_rc).this_key_frame_forced == 0)) &&
     ((cpi->common).current_frame.frame_number != 0)) {
    dVar31 = 2.0;
    frame_type = '\0';
LAB_001e2406:
    iVar11 = av1_compute_qdelta_by_rate(cpi,frame_type,uVar16,dVar31);
  }
  else {
    iVar11 = 0;
    if (((cpi->rc).is_src_frame_alt_ref == 0) &&
       (((cpi->refresh_frame).golden_frame != false ||
        (iVar11 = 0, (cpi->refresh_frame).alt_ref_frame == true)))) {
      dVar31 = 1.75;
      goto LAB_001e2406;
    }
  }
  uVar12 = iVar11 + uVar16;
  *puVar30 = uVar12;
  if ((int)uVar12 <= (int)*local_1080) {
    uVar12 = *local_1080;
  }
  *puVar30 = uVar12;
  if (local_1088 != AOM_Q) {
    if (((cpi->common).current_frame.frame_type == '\0') &&
       ((pAVar8->p_rc).this_key_frame_forced != 0)) {
      uVar13 = (pAVar8->p_rc).last_boosted_qindex;
    }
    else {
      uVar12 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,uVar13,uVar16,width,height);
      uVar13 = uVar12;
      if (((int)*puVar30 < (int)uVar12) &&
         (uVar13 = *puVar30, (cpi->rc).max_frame_bandwidth <= (cpi->rc).this_frame_target)) {
        *puVar30 = uVar12;
        uVar13 = uVar12;
      }
    }
  }
LAB_001e1c07:
  if ((pAVar8->gf_group).update_type[local_1050] == '\x03') {
    (pAVar8->p_rc).arf_q = uVar13;
  }
  return uVar13;
code_r0x001e1fd0:
  if ((*(int *)((long)pYVar9->store_buf_adr + lVar19 * 4 + -0x40) !=
       *(int *)((long)pYVar20->store_buf_adr + lVar19 * 4 + -0x40)) ||
     (lVar26 = lVar19 * 4, lVar2 = lVar19 * 4, lVar19 = lVar19 + 1,
     *(int *)((long)pYVar9->store_buf_adr + lVar26 + -0x38) !=
     *(int *)((long)pYVar20->store_buf_adr + lVar2 + -0x38))) goto LAB_001e1e40;
  goto LAB_001e1fc7;
}

Assistant:

int av1_rc_pick_q_and_bounds(AV1_COMP *cpi, int width, int height, int gf_index,
                             int *bottom_index, int *top_index) {
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  int q;
  // TODO(sarahparker) merge no-stats vbr and altref q computation
  // with rc_pick_q_and_bounds().
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  if ((cpi->oxcf.rc_cfg.mode != AOM_Q ||
       gf_group->update_type[gf_index] == ARF_UPDATE) &&
      has_no_stats_stage(cpi)) {
    if (cpi->oxcf.rc_cfg.mode == AOM_CBR) {
      // TODO(yunqing): the results could be used for encoder optimization.
      cpi->rec_sse = UINT64_MAX;
      if (cpi->sf.hl_sf.accurate_bit_estimate &&
          cpi->common.current_frame.frame_type != KEY_FRAME)
        rc_compute_variance_onepass_rt(cpi);

      q = rc_pick_q_and_bounds_no_stats_cbr(cpi, width, height, bottom_index,
                                            top_index);
      // preserve copy of active worst quality selected.
      cpi->rc.active_worst_quality = *top_index;

#if USE_UNRESTRICTED_Q_IN_CQ_MODE
    } else if (cpi->oxcf.rc_cfg.mode == AOM_CQ) {
      q = rc_pick_q_and_bounds_no_stats_cq(cpi, width, height, bottom_index,
                                           top_index);
#endif  // USE_UNRESTRICTED_Q_IN_CQ_MODE
    } else {
      q = rc_pick_q_and_bounds_no_stats(cpi, width, height, bottom_index,
                                        top_index);
    }
  } else {
    q = rc_pick_q_and_bounds(cpi, width, height, gf_index, bottom_index,
                             top_index);
  }
  if (gf_group->update_type[gf_index] == ARF_UPDATE) p_rc->arf_q = q;

  return q;
}